

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

DynamicTypeHandler * __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::Clone
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,Recycler *recycler)

{
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_00;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  local_18 = recycler;
  recycler_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
             ,0xfc);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  this_00 = (ES5ArrayTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x40,alloc,0x43c4b0);
  ES5ArrayTypeHandlerBase(this_00,local_18,this);
  return (DynamicTypeHandler *)this_00;
}

Assistant:

DynamicTypeHandler * ES5ArrayTypeHandlerBase<T>::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, ES5ArrayTypeHandlerBase, recycler, this);
    }